

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O0

void __thiscall CMU462::DynamicScene::XFormWidget::drawCenterHandle(XFormWidget *this)

{
  const_reference this_00;
  const_reference pvVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  Vector3D local_208;
  double local_1f0;
  Vector3D local_1e8;
  undefined1 local_1d0 [8];
  Vector3D p11;
  double local_1a0;
  Vector3D local_198;
  undefined1 local_180 [8];
  Vector3D p10;
  Vector3D local_150;
  double local_138;
  Vector3D local_130;
  undefined1 local_118 [8];
  Vector3D p01;
  Vector3D local_e8;
  double local_d0;
  Vector3D local_c8;
  undefined1 local_b0 [8];
  Vector3D p00;
  Vector3D local_90;
  undefined1 local_78 [8];
  Vector3D p;
  double s;
  undefined1 local_50 [4];
  int i;
  double local_38;
  double r;
  Vector3D c;
  double handleSize;
  XFormWidget *this_local;
  
  c.z = 0.15;
  Vector3D::Vector3D((Vector3D *)&r,&this->center);
  Vector3D::operator-((Vector3D *)local_50,&(this->bounds).max,&(this->bounds).min);
  local_38 = Vector3D::norm((Vector3D *)local_50);
  local_38 = local_38 / 2.0;
  glBegin(7);
  this_00 = std::
            vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::operator[](&this->axisColors,3);
  pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this_00,0);
  glColor4ubv(pvVar1);
  for (s._4_4_ = 0; s._4_4_ < 3; s._4_4_ = s._4_4_ + 1) {
    for (p.z = -1.0; p.z <= 1.0; p.z = p.z + 2.0) {
      p00.z = local_38 * p.z * 0.15;
      pvVar2 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                         (&this->axes,(long)s._4_4_);
      CMU462::operator*(&local_90,&p00.z,pvVar2);
      Vector3D::operator+((Vector3D *)local_78,(Vector3D *)&r,&local_90);
      local_d0 = local_38 * 0.15;
      pvVar2 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                         (&this->axes,(long)((s._4_4_ + 1) % 3));
      Vector3D::operator-((Vector3D *)&p01.z,pvVar2);
      pvVar2 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                         (&this->axes,(long)((s._4_4_ + 2) % 3));
      Vector3D::operator-(&local_e8,(Vector3D *)&p01.z,pvVar2);
      CMU462::operator*(&local_c8,&local_d0,&local_e8);
      Vector3D::operator+((Vector3D *)local_b0,(Vector3D *)local_78,&local_c8);
      local_138 = local_38 * 0.15;
      pvVar2 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                         (&this->axes,(long)((s._4_4_ + 1) % 3));
      Vector3D::operator-((Vector3D *)&p10.z,pvVar2);
      pvVar2 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                         (&this->axes,(long)((s._4_4_ + 2) % 3));
      Vector3D::operator+(&local_150,(Vector3D *)&p10.z,pvVar2);
      CMU462::operator*(&local_130,&local_138,&local_150);
      Vector3D::operator+((Vector3D *)local_118,(Vector3D *)local_78,&local_130);
      local_1a0 = local_38 * 0.15;
      pvVar2 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                         (&this->axes,(long)((s._4_4_ + 1) % 3));
      pvVar3 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                         (&this->axes,(long)((s._4_4_ + 2) % 3));
      Vector3D::operator-((Vector3D *)&p11.z,pvVar2,pvVar3);
      CMU462::operator*(&local_198,&local_1a0,(Vector3D *)&p11.z);
      Vector3D::operator+((Vector3D *)local_180,(Vector3D *)local_78,&local_198);
      local_1f0 = local_38 * 0.15;
      pvVar2 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                         (&this->axes,(long)((s._4_4_ + 1) % 3));
      pvVar3 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                         (&this->axes,(long)((s._4_4_ + 2) % 3));
      Vector3D::operator+(&local_208,pvVar2,pvVar3);
      CMU462::operator*(&local_1e8,&local_1f0,&local_208);
      Vector3D::operator+((Vector3D *)local_1d0,(Vector3D *)local_78,&local_1e8);
      glVertex3dv(local_b0);
      glVertex3dv(local_118);
      glVertex3dv(local_1d0);
      glVertex3dv(local_180);
    }
  }
  glEnd();
  return;
}

Assistant:

void XFormWidget::drawCenterHandle() const
{
   const double handleSize = .15;
   
   Vector3D c = center;

   double r = (bounds.max - bounds.min).norm() / 2.;

   // Draw center box
   glBegin( GL_QUADS );
   glColor4ubv( &axisColors[3][0] );
   for( int i = 0; i < 3; i++ )
   {
      for( double s = -1.; s <= 1.; s+= 2. )
      {
         Vector3D p = c + r*s*handleSize*axes[i];
         Vector3D p00 = p + r*handleSize*( -axes[(i+1)%3] - axes[(i+2)%3] );
         Vector3D p01 = p + r*handleSize*( -axes[(i+1)%3] + axes[(i+2)%3] );
         Vector3D p10 = p + r*handleSize*(  axes[(i+1)%3] - axes[(i+2)%3] );
         Vector3D p11 = p + r*handleSize*(  axes[(i+1)%3] + axes[(i+2)%3] );

         glVertex3dv( &p00.x );
         glVertex3dv( &p01.x );
         glVertex3dv( &p11.x );
         glVertex3dv( &p10.x );
      }
   }
   glEnd();
}